

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O1

ObjectPtr __thiscall ICM::DefFunc::Lists::sort_f(Lists *this,DataList *dl)

{
  undefined8 *puVar1;
  __normal_iterator<ICM::Object_**,_std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>_>
  __first;
  __normal_iterator<ICM::Object_**,_std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>_>
  __last;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  __normal_iterator<ICM::Object_**,_std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>_> __i
  ;
  __normal_iterator<ICM::Object_**,_std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>_>
  __last_00;
  FuncTableUnit *ftu;
  pointer pFVar5;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Chill_Language[P]ICM_source_runtime_deffunc_cpp:283:43)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Chill_Language[P]ICM_source_runtime_deffunc_cpp:283:43)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Chill_Language[P]ICM_source_runtime_deffunc_cpp:283:43)>
  __comp_01;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Chill_Language[P]ICM_source_runtime_deffunc_cpp:283:43)>
  __comp_02;
  ObjectPtr r;
  DataList local_58;
  Object *local_40;
  undefined8 local_38;
  
  ftu = (FuncTableUnit *)
        (*(dl->_data).super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1]->data
         * 0x78 + GlobalFunctionTable._8_8_);
  local_40 = (Object *)(Static + 0x40);
  local_38 = 0x153690;
  Common::lightlist<ICM::Object*>::lightlist<ICM::Object*const*>
            ((lightlist<ICM::Object*> *)&local_58,&local_40,(Object **)&stack0xffffffffffffffd0);
  sVar3 = getCallID(ftu,&local_58);
  if (local_58._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pFVar5 = (ftu->func).
           super__Vector_base<ICM::Function::FuncObject,_std::allocator<ICM::Function::FuncObject>_>
           ._M_impl.super__Vector_impl_data._M_start + sVar3;
  puVar1 = (undefined8 *)
           (*(dl->_data).super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->data
  ;
  local_58._capacity = 0;
  __first._M_current = (Object **)*puVar1;
  __last._M_current = (Object **)puVar1[1];
  if (__first._M_current != __last._M_current) {
    uVar4 = (long)__last._M_current - (long)__first._M_current >> 3;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    __comp._M_comp.rf = pFVar5;
    __comp._M_comp.r = (ObjectPtr *)&local_58;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<ICM::Object**,std::vector<ICM::Object*,std::allocator<ICM::Object*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ICM::DefFunc::Lists::sort_f(Common::lightlist<ICM::Object*>const&)::__0>>
              (__first,__last,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,__comp);
    if ((long)__last._M_current - (long)__first._M_current < 0x81) {
      __comp_01._M_comp.rf = pFVar5;
      __comp_01._M_comp.r = (ObjectPtr *)&local_58;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<ICM::Object**,std::vector<ICM::Object*,std::allocator<ICM::Object*>>>,__gnu_cxx::__ops::_Iter_comp_iter<ICM::DefFunc::Lists::sort_f(Common::lightlist<ICM::Object*>const&)::__0>>
                (__first,__last,__comp_01);
    }
    else {
      __last_00._M_current = __first._M_current + 0x10;
      __comp_00._M_comp.rf = pFVar5;
      __comp_00._M_comp.r = (ObjectPtr *)&local_58;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<ICM::Object**,std::vector<ICM::Object*,std::allocator<ICM::Object*>>>,__gnu_cxx::__ops::_Iter_comp_iter<ICM::DefFunc::Lists::sort_f(Common::lightlist<ICM::Object*>const&)::__0>>
                (__first,__last_00,__comp_00);
      for (; __last_00._M_current != __last._M_current;
          __last_00._M_current = __last_00._M_current + 1) {
        __comp_02._M_comp.rf = pFVar5;
        __comp_02._M_comp.r = (ObjectPtr *)&local_58;
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<ICM::Object**,std::vector<ICM::Object*,std::allocator<ICM::Object*>>>,__gnu_cxx::__ops::_Val_comp_iter<ICM::DefFunc::Lists::sort_f(Common::lightlist<ICM::Object*>const&)::__0>>
                  (__last_00,__comp_02);
      }
    }
  }
  *(element_type *)this =
       *(dl->_data).super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr sort_f(const DataList &dl) {
				auto &func = dl[1]->get<T_Function>()->getData();
				// TODO
				size_t id = getCallID(func, DataList({ &Static.Zero, &Static.Zero }));
				const auto &rf = func[id];

				Types::List *list = dl[0]->get<T_List>();
				ObjectPtr r;
				std::sort(list->begin(), list->end(), [&](const ObjectPtr &a, const ObjectPtr &b) -> bool {
					r = rf.call(DataList{ a.get(), b.get() });
					bool rr = *r->get<T_Boolean>();
					return rr;
				});
				return ObjectPtr(dl[0]);
			}